

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  char cVar1;
  ImGuiSortDirection IVar2;
  ImGuiTableColumn *pIVar3;
  bool bVar4;
  ImGuiTableColumn *column_1;
  int local_50;
  int column_n_3;
  int column_n_2;
  int column_n_1;
  int column_with_smallest_sort_order;
  int sort_n;
  ImU64 fixed_mask;
  bool need_fix_single_sort_order;
  bool need_fix_linearize;
  ImGuiTableColumn *column;
  ulong uStack_20;
  int column_n;
  ImU64 sort_order_mask;
  int sort_order_count;
  ImGuiTable *table_local;
  
  if ((table->Flags & 8U) == 0) {
    __assert_fail("table->Flags & ImGuiTableFlags_Sortable",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0xa7f,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
  }
  sort_order_mask._4_4_ = 0;
  uStack_20 = 0;
  for (column._4_4_ = 0; column._4_4_ < table->ColumnsCount; column._4_4_ = column._4_4_ + 1) {
    pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column._4_4_);
    if ((pIVar3->SortOrder != -1) && ((pIVar3->IsEnabled & 1U) == 0)) {
      pIVar3->SortOrder = -1;
    }
    if (pIVar3->SortOrder != -1) {
      sort_order_mask._4_4_ = sort_order_mask._4_4_ + 1;
      uStack_20 = 1L << (pIVar3->SortOrder & 0x3fU) | uStack_20;
      if (0x3f < sort_order_mask._4_4_) {
        __assert_fail("sort_order_count < (int)sizeof(sort_order_mask) * 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                      ,0xa8d,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
      }
    }
  }
  bVar4 = false;
  if (1 < sort_order_mask._4_4_) {
    bVar4 = (table->Flags & 0x4000000U) == 0;
  }
  if ((1L << ((byte)sort_order_mask._4_4_ & 0x3f) != uStack_20 + 1) || (bVar4)) {
    _column_with_smallest_sort_order = 0;
    column_n_1 = 0;
LAB_002ce239:
    if (column_n_1 < sort_order_mask._4_4_) {
      column_n_2 = -1;
      for (column_n_3 = 0; column_n_3 < table->ColumnsCount; column_n_3 = column_n_3 + 1) {
        if (((_column_with_smallest_sort_order & 1L << ((byte)column_n_3 & 0x3f)) == 0) &&
           (pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n_3),
           pIVar3->SortOrder != -1)) {
          if (column_n_2 != -1) {
            pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n_3);
            cVar1 = pIVar3->SortOrder;
            pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n_2);
            if (pIVar3->SortOrder <= cVar1) goto LAB_002ce2db;
          }
          column_n_2 = column_n_3;
        }
LAB_002ce2db:
      }
      if (column_n_2 == -1) {
        __assert_fail("column_with_smallest_sort_order != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                      ,0xa9e,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
      }
      _column_with_smallest_sort_order =
           1L << ((byte)column_n_2 & 0x3f) | _column_with_smallest_sort_order;
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n_2);
      pIVar3->SortOrder = (ImGuiTableColumnIdx)column_n_1;
      if (!bVar4) goto LAB_002ce390;
      sort_order_mask._4_4_ = 1;
      for (local_50 = 0; local_50 < table->ColumnsCount; local_50 = local_50 + 1) {
        if (local_50 != column_n_2) {
          pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,local_50);
          pIVar3->SortOrder = -1;
        }
      }
    }
  }
  if ((sort_order_mask._4_4_ == 0) && ((table->Flags & 0x8000000U) == 0)) {
    for (column_1._4_4_ = 0; column_1._4_4_ < table->ColumnsCount;
        column_1._4_4_ = column_1._4_4_ + 1) {
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_1._4_4_);
      if (((pIVar3->IsEnabled & 1U) != 0) && ((pIVar3->Flags & 0x200U) == 0)) {
        sort_order_mask._4_4_ = 1;
        pIVar3->SortOrder = '\0';
        IVar2 = TableGetColumnAvailSortDirection(pIVar3,0);
        pIVar3->field_0x65 = pIVar3->field_0x65 & 0xfc | (byte)IVar2 & 3;
        break;
      }
    }
  }
  table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_mask._4_4_;
  return;
LAB_002ce390:
  column_n_1 = column_n_1 + 1;
  goto LAB_002ce239;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}